

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_pcall(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  int status;
  int in_stack_00000018;
  int in_stack_0000001c;
  lua_State *in_stack_00000020;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  luaL_checkany((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  lua_gettop(in_RDI);
  iVar1 = lua_pcall(in_stack_00000020,in_stack_0000001c,in_stack_00000018,L._4_4_);
  lua_pushboolean(in_RDI,(uint)(iVar1 == 0));
  lua_insert(in_stack_00000020,in_stack_0000001c);
  iVar1 = lua_gettop(in_RDI);
  return iVar1;
}

Assistant:

static int luaB_pcall(lua_State*L){
int status;
luaL_checkany(L,1);
status=lua_pcall(L,lua_gettop(L)-1,(-1),0);
lua_pushboolean(L,(status==0));
lua_insert(L,1);
return lua_gettop(L);
}